

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O0

void __thiscall
wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::
scanLivenessThroughActions
          (LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *this,
          vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *actions,
          SetOfLocals *live)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  value_type *action;
  int i;
  SetOfLocals *live_local;
  vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *actions_local;
  LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *this_local;
  
  sVar2 = std::vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>::size(actions);
  action._4_4_ = (int)sVar2;
  while (action._4_4_ = action._4_4_ + -1, -1 < action._4_4_) {
    this_00 = std::vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>::operator[]
                        (actions,(long)action._4_4_);
    bVar1 = LivenessAction::isGet(this_00);
    if (bVar1) {
      SortedVector::insert(live,this_00->index);
    }
    else {
      bVar1 = LivenessAction::isSet(this_00);
      if (bVar1) {
        SortedVector::erase(live,this_00->index);
      }
    }
  }
  return;
}

Assistant:

void scanLivenessThroughActions(std::vector<LivenessAction>& actions,
                                  SetOfLocals& live) {
    // move towards the front
    for (int i = int(actions.size()) - 1; i >= 0; i--) {
      auto& action = actions[i];
      if (action.isGet()) {
        live.insert(action.index);
      } else if (action.isSet()) {
        live.erase(action.index);
      }
    }
  }